

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

vm_obj_id_t __thiscall CVmObjLookupTable::create_copy(CVmObjLookupTable *this)

{
  uint *puVar1;
  vm_obj_id_t obj_id;
  CVmObjLookupTable *self;
  vm_lookup_ext *this_00;
  
  obj_id = vm_new_id(0,1,0);
  self = (CVmObjLookupTable *)CVmObject::operator_new(0x10,obj_id);
  (self->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_00302ff0;
  (self->super_CVmObjCollection).super_CVmObject.ext_ = (char *)0x0;
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  this_00 = vm_lookup_ext::alloc_ext(self,*puVar1,puVar1[1]);
  (self->super_CVmObjCollection).super_CVmObject.ext_ = (char *)this_00;
  vm_lookup_ext::copy_ext_from
            (this_00,(vm_lookup_ext *)(this->super_CVmObjCollection).super_CVmObject.ext_);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create_copy(VMG0_)
{
    vm_obj_id_t id;
    CVmObjLookupTable *new_obj;
    
    /* allocate the object ID */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* allocate a new object */
    new_obj = new (vmg_ id) CVmObjLookupTable();

    /* 
     *   set up the new object with our same sizes, but don't initialize it
     *   - we're going to blast all of our data directly into the new
     *   extension, so we don't need to waste time setting up an empty
     *   initial state 
     */
    new_obj->ext_ = (char *)vm_lookup_ext::alloc_ext(
        vmg_ new_obj, get_bucket_count(), get_entry_count());

    /* copy my data to the next object */
    new_obj->get_ext()->copy_ext_from(get_ext());

    /* return the new object's id */
    return id;
}